

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

void av1_find_cnn_output_size
               (int in_width,int in_height,CNN_CONFIG *cnn_config,int *out_width,int *out_height,
               int *out_channels)

{
  CNN_LAYER_CONFIG *layer_config;
  BRANCH_COPY BVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  CNN_LAYER_CONFIG *pCVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int o_height;
  int o_width;
  int channels_per_branch [4];
  int i_height [4];
  int i_width [4];
  int local_90;
  int local_8c;
  int local_88 [4];
  ulong local_78;
  undefined8 uStack_70;
  ulong local_68 [3];
  CNN_CONFIG *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_38 = out_channels;
  local_40 = out_height;
  local_48 = out_width;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_68[1] = 0;
  uStack_70 = 0;
  local_68[0] = (ulong)(uint)(in_width + cnn_config->ext_width * 2);
  local_78 = (ulong)(uint)(in_height + cnn_config->ext_height * 2);
  local_50 = cnn_config;
  if (0 < cnn_config->num_layers) {
    lVar8 = 0;
    do {
      layer_config = cnn_config->layer_config + lVar8;
      uVar2 = cnn_config->layer_config[lVar8].branch;
      uVar9 = (ulong)uVar2;
      lVar5 = (long)(int)uVar2;
      local_8c = 0;
      local_90 = 0;
      BVar1 = cnn_config->layer_config[lVar8].branch_copy_type;
      if (BVar1 == '\x01') {
        uVar3 = (layer_config->branch_config).input_to_branches;
        uVar4 = 0;
        do {
          if (uVar9 != uVar4 && (uVar3 >> ((uint)uVar4 & 0x1f) & 1) != 0) {
            *(undefined4 *)((long)local_68 + uVar4 * 4) =
                 *(undefined4 *)((long)local_68 + lVar5 * 4);
            *(undefined4 *)((long)&local_78 + uVar4 * 4) =
                 *(undefined4 *)((long)&local_78 + lVar5 * 4);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 4);
      }
      av1_find_cnn_layer_output_size
                (*(int *)((long)local_68 + lVar5 * 4),*(int *)((long)&local_78 + lVar5 * 4),
                 layer_config,&local_8c,&local_90);
      *(int *)((long)local_68 + lVar5 * 4) = local_8c;
      *(int *)((long)&local_78 + lVar5 * 4) = local_90;
      if (BVar1 == '\x02') {
        uVar3 = (layer_config->branch_config).input_to_branches;
        uVar4 = 0;
        do {
          if (((uVar3 >> ((uint)uVar4 & 0x1f) & 1) != 0) && (uVar2 != uVar4)) {
            *(int *)((long)local_68 + uVar4 * 4) = local_8c;
            *(int *)((long)&local_78 + uVar4 * 4) = local_90;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != 4);
      }
      uVar2 = (layer_config->branch_config).input_to_branches;
      uVar4 = 0;
      do {
        if (((uVar2 >> ((uint)uVar4 & 0x1f) & 1) != 0) && (uVar4 != uVar9)) {
          pCVar6 = layer_config;
          if (BVar1 == '\x01') {
LAB_003b39f4:
            local_88[uVar4] = pCVar6->in_channels;
          }
          else if (BVar1 == '\x03') {
            local_88[uVar4] = layer_config->out_channels;
            uVar3 = (layer_config->branch_config).branches_to_combine;
            uVar7 = 0;
            do {
              if (((uVar3 >> ((uint)uVar7 & 0x1f) & 1) != 0) && (uVar9 != uVar7)) {
                local_88[uVar4] = local_88[uVar4] + local_88[uVar7];
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != 4);
          }
          else {
            pCVar6 = (CNN_LAYER_CONFIG *)&layer_config->out_channels;
            if (BVar1 == '\x02') goto LAB_003b39f4;
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 4);
      local_88[lVar5] = layer_config->out_channels;
      uVar2 = (layer_config->branch_config).branches_to_combine;
      uVar4 = 0;
      do {
        if (((uVar2 >> ((uint)uVar4 & 0x1f) & 1) != 0) && (uVar9 != uVar4)) {
          local_88[lVar5] = local_88[lVar5] + local_88[uVar4];
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 4);
      lVar5 = (long)layer_config->output_num;
      if (lVar5 != -1) {
        local_48[lVar5] = local_8c;
        local_40[lVar5] = local_90;
        local_38[lVar5] = local_88[layer_config->branch];
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_50->num_layers);
  }
  return;
}

Assistant:

void av1_find_cnn_output_size(int in_width, int in_height,
                              const CNN_CONFIG *cnn_config, int *out_width,
                              int *out_height, int *out_channels) {
  int channels_per_branch[CNN_MAX_BRANCHES] = { 0 };
  int i_width[CNN_MAX_BRANCHES] = { 0 };
  int i_height[CNN_MAX_BRANCHES] = { 0 };
  i_width[0] = in_width + cnn_config->ext_width * 2;
  i_height[0] = in_height + cnn_config->ext_height * 2;

#if CONFIG_DEBUG
  assert(cnn_has_at_least_one_output(cnn_config));
#endif

  for (int i = 0; i < cnn_config->num_layers; ++i) {
    const CNN_LAYER_CONFIG *layer_config = &cnn_config->layer_config[i];
    const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;
    const int branch = layer_config->branch;
    int o_width = 0, o_height = 0;

    if (layer_config->branch_copy_type == BRANCH_INPUT) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
          assert(i_width[branch] > 0 && i_height[branch] > 0);
          i_width[b] = i_width[branch];
          i_height[b] = i_height[branch];
        }
      }
    }

    av1_find_cnn_layer_output_size(i_width[branch], i_height[branch],
                                   layer_config, &o_width, &o_height);
    i_width[branch] = o_width;
    i_height[branch] = o_height;

    if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
      for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
        if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
          i_width[b] = o_width;
          i_height[b] = o_height;
        }
      }
    }

    find_cnn_out_channels(layer_config, channels_per_branch);

    const int output_num = layer_config->output_num;
    if (output_num != -1) {  // Current layer is an output layer
      out_width[output_num] = o_width;
      out_height[output_num] = o_height;
      out_channels[output_num] = channels_per_branch[layer_config->branch];
    }
  }
}